

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O2

void linkFiles(string *typeName,uint32_t prevFileLink,uint32_t nextFileLink)

{
  allocator local_331;
  uint32_t nextFileLink_local;
  uint32_t prevFileLink_local;
  string local_328;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  string local_248;
  fstream prevFile;
  char local_218 [512];
  
  nextFileLink_local = nextFileLink;
  prevFileLink_local = prevFileLink;
  if (prevFileLink != 0) {
    std::__cxx11::string::string((string *)&local_2e8,"data/",&local_331);
    std::__cxx11::string::string((string *)&local_248,(string *)typeName);
    truncateName(&local_308,&local_248);
    std::operator+(&local_2c8,&local_2e8,&local_308);
    std::operator+(&local_2a8,&local_2c8,"_");
    std::__cxx11::to_string(&local_328,prevFileLink);
    std::operator+(&local_288,&local_2a8,&local_328);
    std::fstream::fstream(&prevFile,(string *)&local_288,_S_out|_S_in|_S_bin);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::ostream::seekp(local_218,0x12,0);
    std::ostream::write(local_218,(long)&nextFileLink_local);
    std::fstream::close();
    std::fstream::~fstream(&prevFile);
  }
  if (nextFileLink_local != 0) {
    std::__cxx11::string::string((string *)&local_2e8,"data/",&local_331);
    std::__cxx11::string::string((string *)&local_268,(string *)typeName);
    truncateName(&local_308,&local_268);
    std::operator+(&local_2c8,&local_2e8,&local_308);
    std::operator+(&local_2a8,&local_2c8,"_");
    std::__cxx11::to_string(&local_328,nextFileLink_local);
    std::operator+(&local_288,&local_2a8,&local_328);
    std::fstream::fstream(&prevFile,(string *)&local_288,_S_out|_S_in|_S_bin);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::ostream::seekp(local_218,0xe,0);
    std::ostream::write(local_218,(long)&prevFileLink_local);
    std::fstream::close();
    std::fstream::~fstream(&prevFile);
  }
  return;
}

Assistant:

void linkFiles(const string typeName, uint32_t prevFileLink, uint32_t nextFileLink) {
    if (prevFileLink != 0) {
        fstream prevFile(ROOT + truncateName(typeName) + INFIX + to_string(prevFileLink), INOUTBIN);

        prevFile.seekp(IS_FULL + TYPE_NAME + NUM_PAGES + NUM_RECORDS + LINK_TO_FILE);
        prevFile.write((char *) &nextFileLink, LINK_TO_FILE);

        prevFile.close();
    }

    if (nextFileLink != 0) {
        fstream nextFile(ROOT + truncateName(typeName) + INFIX + to_string(nextFileLink), INOUTBIN);

        nextFile.seekp(IS_FULL + TYPE_NAME + NUM_PAGES + NUM_RECORDS);
        nextFile.write((char *) &prevFileLink, LINK_TO_FILE);

        nextFile.close();
    }
}